

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

uint __thiscall dg::vr::RelationsAnalyzer::analyze(RelationsAnalyzer *this,uint maxPass)

{
  bool bVar1;
  ulong uVar2;
  uint *puVar3;
  uint in_ESI;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  *in_RDI;
  uint passNum;
  bool changed;
  Function *function;
  const_iterator __end2;
  const_iterator __begin2;
  Module *__range2;
  uint maxExecutedPass;
  bool in_stack_000000a7;
  Function *in_stack_000000a8;
  RelationsAnalyzer *in_stack_000000b0;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  uint local_38;
  bool local_31;
  reference local_30;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_28;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_20;
  node_pointer local_18;
  uint local_10;
  uint local_c;
  
  local_10 = 0;
  local_18 = in_RDI[6].NodePtr;
  local_c = in_ESI;
  local_20.NodePtr =
       (node_pointer)
       llvm::Module::begin((Module *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  local_28.NodePtr =
       (node_pointer)
       llvm::Module::end((Module *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  while (bVar1 = llvm::operator!=(&local_20,&local_28), bVar1) {
    local_30 = llvm::
               ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
               ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                            *)0x1d3308);
    uVar2 = llvm::GlobalValue::isDeclaration();
    if ((uVar2 & 1) == 0) {
      local_31 = true;
      for (local_38 = 0; local_31 != false && local_38 < local_c; local_38 = local_38 + 1) {
        local_31 = passFunction(in_stack_000000b0,in_stack_000000a8,in_stack_000000a7);
      }
      puVar3 = std::max<unsigned_int>(&local_10,&local_38);
      local_10 = *puVar3;
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
    ::operator++(in_RDI);
  }
  return local_10;
}

Assistant:

unsigned RelationsAnalyzer::analyze(unsigned maxPass) {
    unsigned maxExecutedPass = 0;

    for (const auto &function : module) {
        if (function.isDeclaration())
            continue;

        bool changed = true;
        unsigned passNum = 0;
        while (changed && passNum < maxPass) {
            changed = passFunction(function, false); // passNum + 1 == maxPass);
            ++passNum;
        }

        maxExecutedPass = std::max(maxExecutedPass, passNum);
    }

    return maxExecutedPass;
}